

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentSelector.hpp
# Opt level: O3

Status __thiscall
AO::BehaviorTree::Version_1::Details::ConcurrentSelector<Agent,_short>::execute
          (ConcurrentSelector<Agent,_short> *this,EntityPtr entity,short args)

{
  ChildrenStatusMap *this_00;
  FailurePolicy FVar1;
  pointer psVar2;
  element_type *peVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  mapped_type *pmVar7;
  _Hash_node_base *p_Var8;
  bool bVar9;
  Status SVar10;
  bool bVar11;
  shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_> *child;
  pointer __k;
  
  if ((this->childrenStatus)._M_h._M_element_count == 0) {
    initialize(this,entity);
  }
  __k = (this->super_CompositeNode<Agent,_short>).children.
        super__Vector_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->super_CompositeNode<Agent,_short>).children.
           super__Vector_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__k != psVar2) {
    this_00 = &this->childrenStatus;
    do {
      pmVar7 = std::__detail::
               _Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,__k);
      if (*pmVar7 == Running) {
        peVar3 = (__k->
                 super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        uVar5 = (*(peVar3->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                          (peVar3,entity,(ulong)(uint)(int)args);
        if ((mapped_type)uVar5 != Success) {
          if ((uVar5 & 0xff) != 1) goto LAB_0011ada7;
          if (this->failPolicy == FailOnOne) {
            SVar10 = Failure;
            goto LAB_0011ae97;
          }
        }
        pmVar7 = std::__detail::
                 _Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,__k);
        *pmVar7 = (mapped_type)uVar5;
      }
LAB_0011ada7:
      pmVar7 = std::__detail::
               _Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,__k);
      if ((*pmVar7 == Failure) && (this->failPolicy == FailOnAll)) {
        peVar3 = (__k->
                 super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        iVar6 = (*(peVar3->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                          (peVar3,entity,(ulong)(uint)(int)args);
        pmVar7 = std::__detail::
                 _Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,__k);
        *pmVar7 = (mapped_type)iVar6;
      }
      __k = __k + 1;
    } while (__k != psVar2);
  }
  p_Var8 = (this->childrenStatus)._M_h._M_before_begin._M_nxt;
  FVar1 = this->failPolicy;
  bVar4 = 1;
  if (p_Var8 == (_Hash_node_base *)0x0) {
    bVar9 = false;
    bVar11 = true;
  }
  else {
    bVar11 = true;
    bVar9 = false;
    bVar4 = 1;
    do {
      SVar10 = *(Status *)&p_Var8[3]._M_nxt;
      if (SVar10 == Running) {
        if (this->succeedPolicy == SuccessOnAll && FVar1 == FailOnAll) {
          return Running;
        }
        bVar4 = 0;
LAB_0011ae54:
        bVar11 = false;
      }
      else {
        if (SVar10 == Failure) {
          if (FVar1 != FailOnOne) goto LAB_0011ae54;
          goto LAB_0011ae97;
        }
        if (SVar10 == Success) {
          if (this->succeedPolicy == SuccessOnOne && FVar1 != FailOnOne) goto LAB_0011ae97;
          bVar9 = true;
          bVar4 = 0;
        }
      }
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  SVar10 = Failure;
  if (!(bool)(FVar1 == FailOnAll & bVar4)) {
    if ((this->succeedPolicy != SuccessOnOne) &&
       (bVar9 = bVar11, this->succeedPolicy != SuccessOnAll)) {
      return Running;
    }
    if (!bVar9) {
      return Running;
    }
    SVar10 = Success;
  }
LAB_0011ae97:
  initialize(this,entity);
  return SVar10;
}

Assistant:

Status execute(EntityPtr entity, Args... args) override final
					{
						if (childrenStatus.empty())
						{
							initialize(entity);
						}
						for (auto &child : this->children)
						{
							if (childrenStatus[child] == Status::Running)
							{
								Status const status = child->execute(entity, args...);
								if (status == Status::Failure)
								{
									if (failPolicy == FailurePolicy::FailOnOne)
									{
										initialize(entity);
										return Status::Failure;
									}
									else
									{
										childrenStatus[child] = Status::Failure;
									}
								}
								else if (status == Status::Success)
								{
									childrenStatus[child] = Status::Success;
								}
							}
							if (childrenStatus[child] == Status::Failure && failPolicy == FailurePolicy::FailOnAll)
							{
								childrenStatus[child] = child->execute(entity, args...);
							}
						}
						bool sawSuccess = false;
						bool sawAllFails = true;
						bool sawAllSuccess = true;
						for (auto &pair : childrenStatus)
						{
							switch (pair.second)
							{
							case Status::Success:
								if (succeedPolicy == SuccessPolicy::SuccessOnOne && failPolicy != FailurePolicy::FailOnOne)
								{
									initialize(entity);
									return Status::Success;
								}
								else
								{
									sawSuccess = true;
									sawAllFails = false;
								}
								break;
							case Status::Failure:
								if (failPolicy == FailurePolicy::FailOnOne)
								{
									initialize(entity);
									return Status::Failure;
								}
								else
								{
									sawAllSuccess = false;
								}
								break;
							case Status::Running:
								if (failPolicy == FailurePolicy::FailOnAll && succeedPolicy == SuccessPolicy::SuccessOnAll)
								{
									return Status::Running;
								}
								sawAllFails = false;
								sawAllSuccess = false;
								break;
							default:
								break;
							}
						}
						if (failPolicy == FailurePolicy::FailOnAll && sawAllFails)
						{
							initialize(entity);
							return Status::Failure;
						}
						else if ((succeedPolicy == SuccessPolicy::SuccessOnAll && sawAllSuccess) || (succeedPolicy == SuccessPolicy::SuccessOnOne && sawSuccess))
						{
							initialize(entity);
							return Status::Success;
						}
						else
						{
							return Status::Running;
						}
					}